

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

CoverageBinSymbol *
slang::ast::CoverageBinSymbol::fromSyntax(Scope *scope,BinsSelectionSyntax *syntax)

{
  TokenKind TVar1;
  Compilation *this;
  BinKind BVar2;
  CoverageBinSymbol *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation local_40;
  string_view local_38;
  
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this->super_BumpAllocator,&local_38,&local_40);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  TVar1 = (syntax->keyword).kind;
  if (TVar1 == IgnoreBinsKeyword) {
    BVar2 = IgnoreBins;
  }
  else {
    if (TVar1 != IllegalBinsKeyword) {
      return this_00;
    }
    BVar2 = IllegalBins;
  }
  this_00->binsKind = BVar2;
  return this_00;
}

Assistant:

CoverageBinSymbol& CoverageBinSymbol::fromSyntax(const Scope& scope,
                                                 const BinsSelectionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverageBinSymbol>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    if (syntax.keyword.kind == TokenKind::IgnoreBinsKeyword)
        result->binsKind = IgnoreBins;
    else if (syntax.keyword.kind == TokenKind::IllegalBinsKeyword)
        result->binsKind = IllegalBins;

    return *result;
}